

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

string * jsonnet::internal::(anonymous_namespace)::type_str_abi_cxx11_(Type t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ostream *this_00;
  void *this_01;
  uint in_ESI;
  string *in_RDI;
  string *psVar1;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d;
  uint local_c;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_ESI;
  psVar1 = in_RDI;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_1d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1e);
    break;
  default:
    local_c = in_ESI;
    this_00 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown type: ");
    this_01 = (void *)std::ostream::operator<<(this_00,local_c);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    abort();
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_20);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_21);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_22);
  }
  return psVar1;
}

Assistant:

std::string type_str(Value::Type t)
{
    switch (t) {
        case Value::NULL_TYPE: return "null";
        case Value::BOOLEAN: return "boolean";
        case Value::NUMBER: return "number";
        case Value::ARRAY: return "array";
        case Value::FUNCTION: return "function";
        case Value::OBJECT: return "object";
        case Value::STRING: return "string";
        default:
            std::cerr << "INTERNAL ERROR: Unknown type: " << t << std::endl;
            std::abort();
            return "";  // Quiet, compiler.
    }
}